

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmExpandedCommandArgument *argument;
  _List_node_base *p_Var1;
  pointer pcVar2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  cmState *this_00;
  cmCommand *pcVar6;
  cmTarget *pcVar7;
  ostream *poVar8;
  cmTest *pcVar9;
  char *pcVar10;
  PolicyID id;
  _Self __tmp;
  _List_node_base *p_Var11;
  cmConditionEvaluator *pcVar12;
  cmMakefile *pcVar13;
  string *name;
  _Self __tmp_1;
  int reducible;
  iterator argP2;
  iterator arg;
  PolicyID pid;
  int local_1f4;
  iterator local_1f0;
  _List_node_base *local_1e8;
  iterator local_1e0;
  iterator local_1d8;
  string local_1d0;
  undefined1 local_1b0 [112];
  ios_base local_140 [264];
  undefined8 local_38;
  
  local_1e8 = (_List_node_base *)newArgs;
  do {
    local_1f4 = 0;
    p_Var11 = ((_List_node_base *)newArgs)->_M_next;
    local_1e0._M_node = (_List_node_base *)0x0;
    if (p_Var11 == (_List_node_base *)newArgs) {
      return true;
    }
    do {
      local_1f0._M_node = p_Var11;
      if ((p_Var11 != (_List_node_base *)newArgs) &&
         (local_1f0._M_node =
               (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                  *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
         local_1e0._M_node = local_1f0._M_node, local_1f0._M_node != (_List_node_base *)newArgs)) {
        local_1e0._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_1f0._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      }
      iVar3._M_node = local_1f0._M_node;
      local_1b0._0_8_ = local_1b0 + 0x10;
      local_1d8._M_node = p_Var11;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"EXISTS","");
      argument = (cmExpandedCommandArgument *)(p_Var11 + 1);
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != (_List_node_base *)newArgs) {
          pcVar12 = (cmConditionEvaluator *)iVar3._M_node[1]._M_next;
          bVar4 = cmsys::SystemTools::FileExists((char *)pcVar12);
          HandlePredicate(pcVar12,bVar4,&local_1f4,&local_1d8,newArgs,&local_1f0,&local_1e0);
        }
      }
      else if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"IS_DIRECTORY","");
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      iVar3._M_node = local_1f0._M_node;
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != local_1e8) {
          std::__cxx11::string::string
                    ((string *)local_1b0,(char *)iVar3._M_node[1]._M_next,(allocator *)&local_1d0);
          pcVar12 = (cmConditionEvaluator *)local_1b0;
          bVar4 = cmsys::SystemTools::FileIsDirectory((string *)local_1b0);
          HandlePredicate(pcVar12,bVar4,&local_1f4,&local_1d8,(cmArgumentList *)local_1e8,&local_1f0
                          ,&local_1e0);
          goto LAB_0026d45b;
        }
      }
      else {
LAB_0026d45b:
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
      }
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"IS_SYMLINK","");
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      iVar3._M_node = local_1f0._M_node;
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != local_1e8) {
          std::__cxx11::string::string
                    ((string *)local_1b0,(char *)iVar3._M_node[1]._M_next,(allocator *)&local_1d0);
          pcVar12 = (cmConditionEvaluator *)local_1b0;
          bVar4 = cmsys::SystemTools::FileIsSymlink((string *)local_1b0);
          HandlePredicate(pcVar12,bVar4,&local_1f4,&local_1d8,(cmArgumentList *)local_1e8,&local_1f0
                          ,&local_1e0);
          goto LAB_0026d50f;
        }
      }
      else {
LAB_0026d50f:
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
      }
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"IS_ABSOLUTE","");
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      iVar3._M_node = local_1f0._M_node;
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != local_1e8) {
          pcVar12 = (cmConditionEvaluator *)iVar3._M_node[1]._M_next;
          bVar4 = cmsys::SystemTools::FileIsFullPath((char *)pcVar12);
          HandlePredicate(pcVar12,bVar4,&local_1f4,&local_1d8,(cmArgumentList *)local_1e8,&local_1f0
                          ,&local_1e0);
        }
      }
      else if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"COMMAND","");
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      iVar3._M_node = local_1f0._M_node;
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != local_1e8) {
          this_00 = cmMakefile::GetState(this->Makefile);
          std::__cxx11::string::string
                    ((string *)local_1b0,(char *)iVar3._M_node[1]._M_next,(allocator *)&local_1d0);
          pcVar6 = cmState::GetCommand(this_00,(string *)local_1b0);
          pcVar13 = (cmMakefile *)local_1b0._0_8_;
          if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
          }
          HandlePredicate((cmConditionEvaluator *)pcVar13,pcVar6 != (cmCommand *)0x0,&local_1f4,
                          &local_1d8,(cmArgumentList *)local_1e8,&local_1f0,&local_1e0);
        }
      }
      else if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"POLICY","");
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      iVar3._M_node = local_1f0._M_node;
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != local_1e8) {
          pcVar12 = (cmConditionEvaluator *)iVar3._M_node[1]._M_next;
          bVar4 = cmPolicies::GetPolicyID((char *)pcVar12,(PolicyID *)local_1b0);
          HandlePredicate(pcVar12,bVar4,&local_1f4,&local_1d8,(cmArgumentList *)local_1e8,&local_1f0
                          ,&local_1e0);
        }
      }
      else if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"TARGET","");
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      p_Var1 = local_1e8;
      iVar3._M_node = local_1f0._M_node;
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != p_Var1) {
          pcVar13 = this->Makefile;
          pcVar7 = cmMakefile::FindTargetToUse(pcVar13,(string *)(iVar3._M_node + 1),false);
          HandlePredicate((cmConditionEvaluator *)pcVar13,pcVar7 != (cmTarget *)0x0,&local_1f4,
                          &local_1d8,(cmArgumentList *)p_Var1,&local_1f0,&local_1e0);
        }
      }
      else if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      if (this->Policy64Status < NEW) {
        if (this->Policy64Status == WARN) {
          local_1b0._0_8_ = local_1b0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"TEST","");
          bVar4 = IsKeyword(this,(string *)local_1b0,argument);
          if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
          }
          if (bVar4) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d0,(cmPolicies *)0x40,id);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1b0,local_1d0._M_dataplus._M_p,
                                local_1d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,
                       "TEST will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       ,0x82);
            pcVar13 = this->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(pcVar13,AUTHOR_WARNING,&local_1d0,false);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
            std::ios_base::~ios_base(local_140);
          }
        }
      }
      else {
        local_1b0._0_8_ = local_1b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"TEST","");
        bVar4 = IsKeyword(this,(string *)local_1b0,argument);
        iVar3._M_node = local_1f0._M_node;
        if (bVar4) {
          if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
            operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
          }
          if (iVar3._M_node != local_1e8) {
            pcVar13 = this->Makefile;
            std::__cxx11::string::string
                      ((string *)local_1b0,(char *)iVar3._M_node[1]._M_next,(allocator *)&local_1d0)
            ;
            pcVar9 = cmMakefile::GetTest(pcVar13,(string *)local_1b0);
            p_Var1 = local_1e8;
            pcVar13 = (cmMakefile *)local_1b0._0_8_;
            if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
              operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
            }
            HandlePredicate((cmConditionEvaluator *)pcVar13,pcVar9 != (cmTest *)0x0,&local_1f4,
                            &local_1d8,(cmArgumentList *)p_Var1,&local_1f0,&local_1e0);
          }
        }
        else if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
      }
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"DEFINED","");
      bVar4 = IsKeyword(this,(string *)local_1b0,argument);
      newArgs = (cmArgumentList *)local_1e8;
      iVar3._M_node = local_1f0._M_node;
      if (bVar4) {
        if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
          operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
        }
        if (iVar3._M_node != (_List_node_base *)newArgs) {
          p_Var1 = iVar3._M_node[1]._M_prev;
          name = (string *)(iVar3._M_node + 1);
          if (p_Var1 < (_List_node_base *)0x5) {
LAB_0026db96:
            pcVar13 = this->Makefile;
            bVar4 = cmMakefile::IsDefinitionSet(pcVar13,name);
          }
          else {
            local_38 = 0;
            std::__cxx11::string::substr((ulong)local_1b0,(ulong)name);
            iVar5 = std::__cxx11::string::compare((char *)local_1b0);
            if (iVar5 == 0) {
              pcVar2 = (name->_M_dataplus)._M_p;
              local_38 = CONCAT71((int7)((ulong)pcVar2 >> 8),(pcVar2 + -1)[(long)p_Var1] == '}');
            }
            if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
              operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
            }
            if ((char)local_38 == '\0') goto LAB_0026db96;
            std::__cxx11::string::substr((ulong)local_1b0,(ulong)name);
            pcVar10 = cmsys::SystemTools::GetEnv((char *)local_1b0._0_8_);
            bVar4 = pcVar10 != (char *)0x0;
            pcVar13 = (cmMakefile *)local_1b0._0_8_;
            if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
              operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
            }
          }
          HandlePredicate((cmConditionEvaluator *)pcVar13,bVar4,&local_1f4,&local_1d8,newArgs,
                          &local_1f0,&local_1e0);
        }
      }
      else if ((cmMakefile *)local_1b0._0_8_ != (cmMakefile *)(local_1b0 + 0x10)) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      p_Var11 = (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                   *)&p_Var11->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var11 != (_List_node_base *)newArgs);
    if (local_1f4 == 0) {
      return true;
    }
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList &newArgs,
                  std::string &, cmake::MessageType &)
{
  int reducible;
  do
    {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end())
      {
      argP1 = arg;
      this->IncrementArguments(newArgs,argP1,argP2);
      // does a file exist
      if (this->IsKeyword("EXISTS", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileExists(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a directory with this name exist
      if (this->IsKeyword("IS_DIRECTORY", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsDirectory(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a symlink with this name exist
      if (this->IsKeyword("IS_SYMLINK", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsSymlink(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // is the given path an absolute path ?
      if (this->IsKeyword("IS_ABSOLUTE", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          cmSystemTools::FileIsFullPath(argP1->c_str()),
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a command exist
      if (this->IsKeyword("COMMAND", *arg) && argP1 != newArgs.end())
        {
        cmCommand* command =
            this->Makefile.GetState()->GetCommand(argP1->c_str());
        this->HandlePredicate(
          command ? true : false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a policy exist
      if (this->IsKeyword("POLICY", *arg) && argP1 != newArgs.end())
        {
        cmPolicies::PolicyID pid;
        this->HandlePredicate(
          cmPolicies::GetPolicyID(argP1->c_str(), pid),
            reducible, arg, newArgs, argP1, argP2);
        }
      // does a target exist
      if (this->IsKeyword("TARGET", *arg) && argP1 != newArgs.end())
        {
        this->HandlePredicate(
          this->Makefile.FindTargetToUse(argP1->GetValue())?true:false,
          reducible, arg, newArgs, argP1, argP2);
        }
      // does a test exist
      if(this->Policy64Status != cmPolicies::OLD &&
        this->Policy64Status != cmPolicies::WARN)
        {
        if (this->IsKeyword("TEST", *arg) && argP1 != newArgs.end())
          {
          const cmTest* haveTest = this->Makefile.GetTest(argP1->c_str());
          this->HandlePredicate(
            haveTest?true:false,
            reducible, arg, newArgs, argP1, argP2);
          }
        }
      else if(this->Policy64Status == cmPolicies::WARN &&
        this->IsKeyword("TEST", *arg))
        {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0064) << "\n";
        e << "TEST will be interpreted as an operator "
          "when the policy is set to NEW.  "
          "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(cmake::AUTHOR_WARNING, e.str());
        }
      // is a variable defined
      if (this->IsKeyword("DEFINED", *arg) && argP1 != newArgs.end())
        {
        size_t argP1len = argP1->GetValue().size();
        bool bdef = false;
        if(argP1len > 4 && argP1->GetValue().substr(0, 4) == "ENV{" &&
           argP1->GetValue().operator[](argP1len-1) == '}')
          {
          std::string env = argP1->GetValue().substr(4, argP1len-5);
          bdef = cmSystemTools::GetEnv(env.c_str())?true:false;
          }
        else
          {
          bdef = this->Makefile.IsDefinitionSet(argP1->GetValue());
          }
        this->HandlePredicate(bdef, reducible, arg, newArgs, argP1, argP2);
        }
      ++arg;
      }
    }
  while (reducible);
  return true;
}